

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

QJsonObject __thiscall ClassDef::toJson(ClassDef *this)

{
  bool bVar1;
  char *pcVar2;
  qsizetype qVar3;
  long lVar4;
  storage_type *in_RCX;
  long lVar5;
  long in_RSI;
  ClassInfoDef *info;
  QByteArray *pQVar6;
  ClassDef *cdef;
  long lVar7;
  PropertyDef *propDef;
  char **rhs;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView key_05;
  QLatin1StringView key_06;
  QLatin1StringView key_07;
  QLatin1StringView key_08;
  QLatin1StringView key_09;
  QLatin1StringView key_10;
  QLatin1StringView key_11;
  QLatin1StringView key_12;
  QLatin1StringView key_13;
  QLatin1StringView key_14;
  QLatin1StringView key_15;
  QJsonObject ifaceJson;
  QJsonArray jsonList;
  QJsonArray ifaces;
  QJsonObject infoJson;
  QJsonObject local_c8;
  QJsonArray enums;
  QJsonArray superClasses;
  QJsonArray props;
  int methodIndex;
  QJsonArray classInfos;
  QByteArrayView local_98;
  anon_class_16_2_d6ba3f70 local_88;
  QByteArrayView local_78;
  QJsonValueConstRef local_68;
  Data *local_38;
  
  local_c8.o.d.ptr = infoJson.o.d.ptr;
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  (this->super_BaseDef).classname.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  pcVar2 = *(char **)(in_RSI + 8);
  if ((QCborContainerPrivate *)pcVar2 == (QCborContainerPrivate *)0x0) {
    pcVar2 = &QByteArray::_empty;
  }
  infoJson.o.d.ptr =
       (QExplicitlySharedDataPointer<QCborContainerPrivate>)
       (QExplicitlySharedDataPointer<QCborContainerPrivate>)pcVar2;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_78,(char **)&infoJson);
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)local_78.m_data;
  QString::fromUtf8((QString *)&stack0xffffffffffffff98,(QString *)local_78.m_size,ba);
  QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98)
  ;
  key.m_size = 9;
  key.m_data = "className";
  local_88 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[]((QJsonObject *)this,key);
  QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&stack0xffffffffffffffb0);
  QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
  pcVar2 = *(char **)(in_RSI + 0x20);
  if ((QCborContainerPrivate *)pcVar2 == (QCborContainerPrivate *)0x0) {
    pcVar2 = &QByteArray::_empty;
  }
  infoJson.o.d.ptr =
       (QExplicitlySharedDataPointer<QCborContainerPrivate>)
       (QExplicitlySharedDataPointer<QCborContainerPrivate>)pcVar2;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_98,(char **)&infoJson);
  ba_00.m_data = in_RCX;
  ba_00.m_size = (qsizetype)local_98.m_data;
  QString::fromUtf8((QString *)&stack0xffffffffffffff98,(QString *)local_98.m_size,ba_00);
  QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98)
  ;
  key_00.m_size = 0x12;
  key_00.m_data = "qualifiedClassName";
  local_88 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[]((QJsonObject *)this,key_00);
  QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&stack0xffffffffffffffb0);
  QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
  QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,*(qint64 *)(in_RSI + 0x80));
  key_01.m_size = 10;
  key_01.m_data = "lineNumber";
  local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_01);
  QJsonValueRef::operator=
            ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
  QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  classInfos.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&classInfos);
  pQVar6 = *(QByteArray **)(in_RSI + 0x38);
  for (lVar5 = *(long *)(in_RSI + 0x40) * 0x30; lVar5 != 0; lVar5 = lVar5 + -0x30) {
    infoJson.o.d.ptr =
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (totally_ordered_wrapper<QCborContainerPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject(&infoJson);
    QString::fromUtf8<void>((QString *)&stack0xffffffffffffff98,pQVar6);
    QJsonValue::QJsonValue
              ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
    key_02.m_size = 4;
    key_02.m_data = "name";
    local_88 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[](&infoJson,key_02);
    QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
    QString::fromUtf8<void>((QString *)&stack0xffffffffffffff98,pQVar6 + 1);
    QJsonValue::QJsonValue
              ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
    key_03.m_size = 5;
    key_03.m_data = "value";
    local_88 = (anon_class_16_2_d6ba3f70)QJsonObject::operator[](&infoJson,key_03);
    QJsonValueRef::operator=((QJsonValueRef *)&local_88,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&infoJson);
    QJsonArray::append(&classInfos,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QJsonObject::~QJsonObject(&infoJson);
    pQVar6 = pQVar6 + 2;
  }
  qVar3 = QJsonArray::size(&classInfos);
  if (qVar3 != 0) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&classInfos);
    key_04.m_size = 10;
    key_04.m_data = "classInfos";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_04);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  methodIndex = 0;
  local_88.methodIndex = &methodIndex;
  local_88.cls = (QJsonObject *)this;
  latin1.m_size = 7;
  latin1.m_data = "signals";
  QString::QString((QString *)&stack0xffffffffffffffb0,latin1);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)&stack0xffffffffffffffb0,(QList<FunctionDef> *)(in_RSI + 0x110));
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb0);
  latin1_00.m_size = 5;
  latin1_00.m_data = "slots";
  QString::QString((QString *)&stack0xffffffffffffffb0,latin1_00);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)&stack0xffffffffffffffb0,(QList<FunctionDef> *)(in_RSI + 0x128));
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb0);
  latin1_01.m_size = 7;
  latin1_01.m_data = "methods";
  QString::QString((QString *)&stack0xffffffffffffffb0,latin1_01);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)&stack0xffffffffffffffb0,(QList<FunctionDef> *)(in_RSI + 0x140));
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb0);
  methodIndex = 0;
  latin1_02.m_size = 0xc;
  latin1_02.m_data = "constructors";
  QString::QString((QString *)&stack0xffffffffffffffb0,latin1_02);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (&local_88,(QString *)&stack0xffffffffffffffb0,(QList<FunctionDef> *)(in_RSI + 0xf8));
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb0);
  props.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&props);
  for (lVar5 = *(long *)(in_RSI + 0x198) * 0x158; lVar5 != 0; lVar5 = lVar5 + -0x158) {
    PropertyDef::toJson((PropertyDef *)&stack0xffffffffffffff98);
    QJsonValue::QJsonValue
              ((QJsonValue *)&stack0xffffffffffffffb0,(QJsonObject *)&stack0xffffffffffffff98);
    QJsonArray::append(&props,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QJsonObject::~QJsonObject((QJsonObject *)&stack0xffffffffffffff98);
  }
  bVar1 = QJsonArray::isEmpty(&props);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&props);
    key_05.m_size = 10;
    key_05.m_data = "properties";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_05);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  if (*(char *)(in_RSI + 0x1a4) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,true);
    key_06.m_size = 6;
    key_06.m_data = "object";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_06);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  if (*(char *)(in_RSI + 0x1a5) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,true);
    key_07.m_size = 6;
    key_07.m_data = "gadget";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_07);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  if (*(char *)(in_RSI + 0x1a6) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,true);
    key_08.m_size = 9;
    key_08.m_data = "namespace";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_08);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  superClasses.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&superClasses);
  rhs = (char **)(*(long *)(in_RSI + 0x90) + 0x18);
  for (lVar5 = *(long *)(in_RSI + 0x98) * 0x38; lVar5 != 0; lVar5 = lVar5 + -0x38) {
    enums.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&enums);
    QString::fromUtf8<void>((QString *)&stack0xffffffffffffff98,(QByteArray *)(rhs + -3));
    QJsonValue::QJsonValue
              ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
    key_09.m_size = 4;
    key_09.m_data = "name";
    _infoJson = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)&enums,key_09);
    QJsonValueRef::operator=((QJsonValueRef *)&infoJson,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
    bVar1 = operator!=((QByteArray *)(rhs + -3),(QByteArray *)rhs);
    if (bVar1) {
      QString::fromUtf8<void>((QString *)&stack0xffffffffffffff98,(QByteArray *)rhs);
      QJsonValue::QJsonValue
                ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
      key_10.m_size = 0x12;
      key_10.m_data = "fullyQualifiedName";
      _infoJson = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)&enums,key_10);
      QJsonValueRef::operator=((QJsonValueRef *)&infoJson,(QJsonValue *)&stack0xffffffffffffffb0);
      QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
    }
    FunctionDef::accessToJson((QJsonObject *)&enums,*(Access *)&(((QByteArray *)(rhs + 3))->d).d);
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,(QJsonObject *)&enums);
    QJsonArray::append(&superClasses,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QJsonObject::~QJsonObject((QJsonObject *)&enums);
    rhs = rhs + 7;
  }
  bVar1 = QJsonArray::isEmpty(&superClasses);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&superClasses);
    key_11.m_size = 0xc;
    key_11.m_data = "superClasses";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_11);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  enums.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&enums);
  cdef = *(ClassDef **)(in_RSI + 0x58);
  for (lVar5 = *(long *)(in_RSI + 0x60) * 0x68; lVar5 != 0; lVar5 = lVar5 + -0x68) {
    EnumDef::toJson((EnumDef *)&stack0xffffffffffffff98,cdef);
    QJsonValue::QJsonValue
              ((QJsonValue *)&stack0xffffffffffffffb0,(QJsonObject *)&stack0xffffffffffffff98);
    QJsonArray::append(&enums,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QJsonObject::~QJsonObject((QJsonObject *)&stack0xffffffffffffff98);
    cdef = (ClassDef *)&(cdef->super_BaseDef).flagAliases;
  }
  bVar1 = QJsonArray::isEmpty(&enums);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&enums);
    key_12.m_size = 5;
    key_12.m_data = "enums";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_12);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  ifaces.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&ifaces);
  lVar5 = *(long *)(in_RSI + 0xa8);
  lVar4 = *(long *)(in_RSI + 0xb0) * 0x18 + lVar5;
  for (; lVar5 != lVar4; lVar5 = lVar5 + 0x18) {
    jsonList.a.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&jsonList);
    pQVar6 = *(QByteArray **)(lVar5 + 8);
    for (lVar7 = *(long *)(lVar5 + 0x10) * 0x30; lVar7 != 0; lVar7 = lVar7 + -0x30) {
      ifaceJson.o.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa
      ;
      QJsonObject::QJsonObject(&ifaceJson);
      QString::fromUtf8<void>((QString *)&stack0xffffffffffffff98,pQVar6 + 1);
      QJsonValue::QJsonValue
                ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
      key_13.m_size = 2;
      key_13.m_data = "id";
      _infoJson = (QJsonValueConstRef)QJsonObject::operator[](&ifaceJson,key_13);
      QJsonValueRef::operator=((QJsonValueRef *)&infoJson,(QJsonValue *)&stack0xffffffffffffffb0);
      QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
      QString::fromUtf8<void>((QString *)&stack0xffffffffffffff98,pQVar6);
      QJsonValue::QJsonValue
                ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
      key_14.m_size = 9;
      key_14.m_data = "className";
      _infoJson = (QJsonValueConstRef)QJsonObject::operator[](&ifaceJson,key_14);
      QJsonValueRef::operator=((QJsonValueRef *)&infoJson,(QJsonValue *)&stack0xffffffffffffffb0);
      QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98);
      QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&ifaceJson);
      QJsonArray::append(&jsonList,(QJsonValue *)&stack0xffffffffffffffb0);
      QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
      QJsonObject::~QJsonObject(&ifaceJson);
      pQVar6 = pQVar6 + 2;
    }
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&jsonList);
    QJsonArray::append(&ifaces,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    QJsonArray::~QJsonArray(&jsonList);
  }
  bVar1 = QJsonArray::isEmpty(&ifaces);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,&ifaces);
    key_15.m_size = 10;
    key_15.m_data = "interfaces";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_15);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  QJsonArray::~QJsonArray(&ifaces);
  QJsonArray::~QJsonArray(&enums);
  QJsonArray::~QJsonArray(&superClasses);
  QJsonArray::~QJsonArray(&props);
  QJsonArray::~QJsonArray(&classInfos);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject ClassDef::toJson() const
{
    QJsonObject cls;
    cls["className"_L1] = QString::fromUtf8(classname.constData());
    cls["qualifiedClassName"_L1] = QString::fromUtf8(qualified.constData());
    cls["lineNumber"_L1] = lineNumber;

    QJsonArray classInfos;
    for (const auto &info: std::as_const(classInfoList)) {
        QJsonObject infoJson;
        infoJson["name"_L1] = QString::fromUtf8(info.name);
        infoJson["value"_L1] = QString::fromUtf8(info.value);
        classInfos.append(infoJson);
    }

    if (classInfos.size())
        cls["classInfos"_L1] = classInfos;

    int methodIndex = 0;
    const auto appendFunctions
            = [&cls, &methodIndex](const QString &type, const QList<FunctionDef> &funcs) {
        QJsonArray jsonFuncs;

        for (const FunctionDef &fdef: funcs)
            jsonFuncs.append(fdef.toJson(methodIndex++));

        if (!jsonFuncs.isEmpty())
            cls[type] = jsonFuncs;
    };

    // signals, slots, and methods, in this order, follow the same index
    appendFunctions("signals"_L1, signalList);
    appendFunctions("slots"_L1, slotList);
    appendFunctions("methods"_L1, methodList);

    // constructors are indexed separately.
    methodIndex = 0;
    appendFunctions("constructors"_L1, constructorList);

    QJsonArray props;

    for (const PropertyDef &propDef: std::as_const(propertyList))
        props.append(propDef.toJson());

    if (!props.isEmpty())
        cls["properties"_L1] = props;

    if (hasQObject)
        cls["object"_L1] = true;
    if (hasQGadget)
        cls["gadget"_L1] = true;
    if (hasQNamespace)
        cls["namespace"_L1] = true;

    QJsonArray superClasses;

    for (const auto &super: std::as_const(superclassList)) {
        QJsonObject superCls;
        superCls["name"_L1] = QString::fromUtf8(super.classname);
        if (super.classname != super.qualified)
            superCls["fullyQualifiedName"_L1] = QString::fromUtf8(super.qualified);
        FunctionDef::accessToJson(&superCls, super.access);
        superClasses.append(superCls);
    }

    if (!superClasses.isEmpty())
        cls["superClasses"_L1] = superClasses;

    QJsonArray enums;
    for (const EnumDef &enumDef: std::as_const(enumList))
        enums.append(enumDef.toJson(*this));
    if (!enums.isEmpty())
        cls["enums"_L1] = enums;

    QJsonArray ifaces;
    for (const QList<Interface> &ifaceList : interfaceList) {
        QJsonArray jsonList;
        for (const Interface &iface: ifaceList) {
            QJsonObject ifaceJson;
            ifaceJson["id"_L1] = QString::fromUtf8(iface.interfaceId);
            ifaceJson["className"_L1] = QString::fromUtf8(iface.className);
            jsonList.append(ifaceJson);
        }
        ifaces.append(jsonList);
    }
    if (!ifaces.isEmpty())
        cls["interfaces"_L1] = ifaces;

    return cls;
}